

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

uint32_t __thiscall
cfd::ConfidentialTransactionContext::GetVsizeIgnoreTxIn
          (ConfidentialTransactionContext *this,bool is_blinded,int exponent,int minimum_bits,
          uint32_t asset_count)

{
  uint32_t uVar1;
  uint32_t no_witness_size;
  uint32_t witness_size;
  int in_stack_000000b0;
  int in_stack_000000b4;
  uint32_t *in_stack_000000b8;
  uint32_t *in_stack_000000c0;
  bool in_stack_000000cf;
  ConfidentialTransactionContext *in_stack_000000d0;
  uint32_t in_stack_000000e0;
  
  GetSizeIgnoreTxIn(in_stack_000000d0,in_stack_000000cf,in_stack_000000c0,in_stack_000000b8,
                    in_stack_000000b4,in_stack_000000b0,in_stack_000000e0);
  uVar1 = core::AbstractTransaction::GetVsizeFromSize(0,0);
  return uVar1;
}

Assistant:

uint32_t ConfidentialTransactionContext::GetVsizeIgnoreTxIn(
    bool is_blinded, int exponent, int minimum_bits,
    uint32_t asset_count) const {
  uint32_t witness_size = 0;
  uint32_t no_witness_size = 0;
  GetSizeIgnoreTxIn(
      is_blinded, &witness_size, &no_witness_size, exponent, minimum_bits,
      asset_count);
  return AbstractTransaction::GetVsizeFromSize(no_witness_size, witness_size);
}